

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::probeUnit_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  unit uVar1;
  long lVar2;
  unit_data uVar3;
  long *plVar4;
  unit *puVar5;
  size_type *psVar6;
  long *plVar7;
  unit uVar8;
  precise_unit pVar9;
  __string_type __str;
  string fnd;
  unit in_stack_ffffffffffffff18;
  unit uVar10;
  ulong local_e0;
  long local_d8;
  unit uStack_d0;
  double local_c8;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  unit local_a0;
  unit local_98;
  long local_90;
  unit uStack_88;
  double local_80;
  undefined8 local_78;
  long *local_70;
  ulong local_68;
  long local_60;
  long lStack_58;
  unit local_50 [2];
  long local_40 [2];
  
  local_c8 = *(double *)this * un->multiplier_;
  uVar3 = detail::unit_data::operator*((unit_data *)(this + 8),&un->base_units_);
  local_78 = CONCAT44(un->commodity_ | *(uint *)(this + 0xc),uVar3);
  local_80 = local_c8;
  find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
  if (local_b8 == 0) {
    local_c8 = local_80;
    detail::unit_data::inv((unit_data *)&local_78);
    find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&stack0xffffffffffffff18);
    if (in_stack_ffffffffffffff18 != (unit)&local_d8) {
      operator_delete((void *)in_stack_ffffffffffffff18,local_d8 + 1);
    }
    if (local_b8 == 0) {
      pVar9 = precise_unit::operator/((precise_unit *)this,un);
      local_78 = pVar9._8_8_;
      local_80 = pVar9.multiplier_;
      find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&stack0xffffffffffffff18);
      if (in_stack_ffffffffffffff18 != (unit)&local_d8) {
        operator_delete((void *)in_stack_ffffffffffffff18,local_d8 + 1);
      }
      if (local_b8 == 0) {
        local_c8 = local_80;
        detail::unit_data::inv((unit_data *)&local_78);
        find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&stack0xffffffffffffff18);
        if (in_stack_ffffffffffffff18 != (unit)&local_d8) {
          operator_delete((void *)in_stack_ffffffffffffff18,local_d8 + 1);
        }
        if (local_b8 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          goto LAB_00163f60;
        }
        std::__cxx11::string::string
                  ((string *)&local_a0,(char *)un[1].multiplier_,(allocator *)&local_70);
        puVar5 = (unit *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_a0,(ulong)local_98,0,'\x01');
        uVar8 = (unit)(puVar5 + 2);
        if (*puVar5 == uVar8) {
          local_d8 = *(long *)uVar8;
          uStack_d0 = puVar5[3];
          uVar10 = (unit)&local_d8;
        }
        else {
          local_d8 = *(long *)uVar8;
          uVar10 = *puVar5;
        }
        *puVar5 = uVar8;
        puVar5[1].multiplier_ = 0.0;
        puVar5[1].base_units_ = (unit_data)0x0;
        *(undefined1 *)&puVar5[2].multiplier_ = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append(&stack0xffffffffffffff18,(ulong)local_c0);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar6) {
          lVar2 = plVar4[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        }
        __return_storage_ptr__->_M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (uVar10 != (unit)&local_d8) {
          operator_delete((void *)uVar10,local_d8 + 1);
        }
        local_40[0] = local_90;
        uVar8 = local_a0;
        if (local_a0 == (unit)&local_90) goto LAB_00163f60;
      }
      else {
        uVar8 = (unit)&local_d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xffffffffffffff18,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::_M_replace_aux((ulong)&stack0xffffffffffffff18,local_e0,0,'\x01');
        plVar4 = (long *)std::__cxx11::string::append(&stack0xffffffffffffff18);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar6) {
          lVar2 = plVar4[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        }
        __return_storage_ptr__->_M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        local_40[0] = local_d8;
        if (uVar8 == (unit)&local_d8) goto LAB_00163f60;
      }
    }
    else {
      local_50[0] = (unit)local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"1/(","");
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_c0);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
        local_70 = (long *)*plVar4;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (unit *)std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
      uVar8 = (unit)(puVar5 + 2);
      if (*puVar5 == uVar8) {
        local_90 = *(long *)uVar8;
        uStack_88 = puVar5[3];
        local_a0 = (unit)&local_90;
      }
      else {
        local_90 = *(long *)uVar8;
        local_a0 = *puVar5;
      }
      local_98 = puVar5[1];
      *puVar5 = uVar8;
      puVar5[1].multiplier_ = 0.0;
      puVar5[1].base_units_ = (unit_data)0x0;
      *(undefined1 *)&puVar5[2].multiplier_ = 0;
      puVar5 = (unit *)std::__cxx11::string::append((char *)&local_a0);
      uVar8 = (unit)(puVar5 + 2);
      if (*puVar5 == uVar8) {
        local_d8 = *(long *)uVar8;
        uStack_d0 = puVar5[3];
        uVar10 = (unit)&local_d8;
      }
      else {
        local_d8 = *(long *)uVar8;
        uVar10 = *puVar5;
      }
      uVar1 = puVar5[1];
      *puVar5 = uVar8;
      puVar5[1].multiplier_ = 0.0;
      puVar5[1].base_units_ = (unit_data)0x0;
      *(undefined1 *)&puVar5[2].multiplier_ = 0;
      plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&stack0xffffffffffffff18,(ulong)uVar1,0,'\x01');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (uVar10 != (unit)&local_d8) {
        operator_delete((void *)uVar10,local_d8 + 1);
      }
      if (local_a0 != (unit)&local_90) {
        operator_delete((void *)local_a0,local_90 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      uVar8 = local_50[0];
      if (local_50[0] == (unit)local_40) goto LAB_00163f60;
    }
  }
  else {
    uVar8 = (unit)&local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff18,local_c0,local_b8 + (long)local_c0);
    std::__cxx11::string::_M_replace_aux((ulong)&stack0xffffffffffffff18,local_e0,0,'\x01');
    plVar4 = (long *)std::__cxx11::string::append(&stack0xffffffffffffff18);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_40[0] = local_d8;
    if (uVar8 == (unit)&local_d8) goto LAB_00163f60;
  }
  operator_delete((void *)uVar8,local_40[0] + 1);
LAB_00163f60:
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string probeUnit(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    // let's try common divisor units
    auto ext = un * probe.first;
    auto fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '/' + probe.second;
    }
    // let's try inverse of common multiplier units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string("1/(") + fnd + '*' + probe.second + ')';
    }

    // let's try common multiplier units
    ext = un / probe.first;
    fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '*' + probe.second;
    }
    // let's try common divisor with inv units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string(probe.second) + '/' + fnd;
    }
    return std::string{};
}